

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

win32 * __thiscall pstore::path::win32::dir_name(win32 *this,string *src_path)

{
  string local_e0 [32];
  undefined8 local_c0;
  size_type pos;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  string local_58 [8];
  string p;
  string local_38 [8];
  string drive;
  string *src_path_local;
  
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string(local_58);
  split_drive(&local_98,src_path);
  std::tie<std::__cxx11::string,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
            ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)&pos,&local_98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_98);
  local_c0 = std::__cxx11::string::find_last_of((char *)local_58,0x1678ce);
  std::__cxx11::string::substr((ulong)local_e0,(ulong)local_58);
  std::__cxx11::string::operator=(local_58,local_e0);
  std::__cxx11::string::~string(local_e0);
  join(this,(string *)local_38,(string *)local_58);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

std::string dir_name (std::string const & src_path) {
                std::string drive;
                std::string p;
                std::tie (drive, p) = path::win32::split_drive (src_path);

                std::string::size_type const pos = p.find_last_of (R"(/\)");
                p = p.substr (0, (pos == std::string::npos) ? 0 : pos + 1);
                return path::win32::join (drive, p);
            }